

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass_table.hpp
# Opt level: O3

int __thiscall squall::detail::KlassImp<Foo>::close(KlassImp<Foo> *this,int __fd)

{
  HSQUIRRELVM v;
  int in_EAX;
  int extraout_EAX;
  SQInteger newtop;
  HSQOBJECT obj;
  keeper k;
  
  if (this->closed_ == false) {
    v = this->vm_;
    newtop = sq_gettop(v);
    sq_pushroottable(this->vm_);
    sq_pushstring(this->vm_,(this->name_)._M_dataplus._M_p,-1);
    obj._4_4_ = 0;
    obj._type = (this->sqclass_)._type;
    obj._unVal.pTable = (this->sqclass_)._unVal.pTable;
    sq_pushobject(this->vm_,obj);
    sq_newslot(this->vm_,-3,0);
    this->closed_ = true;
    sq_settop(v,newtop);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

void close() {
        if (closed_) { return; }

        keeper k(vm_);
        sq_pushroottable(vm_);
        sq_pushstring(vm_, name_.c_str(), -1);
        sq_pushobject(vm_, sqclass_);
        sq_createslot(vm_, -3);

        closed_ = true;
    }